

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9Texture.cpp
# Opt level: O0

uint32_t __thiscall
GmmLib::GmmGen9TextureCalc::Get2DMipMapTotalHeight
          (GmmGen9TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo)

{
  uint32_t UnitAlignment;
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t local_68;
  uint32_t local_5c;
  uint local_50;
  uint local_4c;
  uint32_t AlignedHeightLines;
  uint32_t VAlign;
  uint32_t MipLevel;
  uint32_t i;
  uint32_t HeightLinesLevel2;
  uint32_t HeightLinesLevel1;
  uint32_t HeightLinesLevel0;
  uint32_t MipHeight;
  uint32_t BlockHeight;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmGen9TextureCalc *this_local;
  
  local_50 = pTexInfo->MaxLod;
  UnitAlignment = (pTexInfo->Alignment).VAlign;
  if (((((ulong)(pTexInfo->Flags).Info >> 0x25 & 1) != 0) ||
      (((ulong)(pTexInfo->Flags).Info >> 0x26 & 1) != 0)) ||
     (((ulong)(pTexInfo->Flags).Info >> 0x2c & 1) != 0)) {
    local_4c = local_50;
    if ((pTexInfo->Alignment).MipTailStartLod <= local_50) {
      local_4c = (pTexInfo->Alignment).MipTailStartLod;
    }
    local_50 = local_4c;
  }
  if ((((ulong)(pTexInfo->Flags).Gpu >> 6 & 1) == 0) &&
     (((ulong)(pTexInfo->Flags).Gpu >> 0x1d & 1) == 0)) {
    local_5c = 1;
  }
  else {
    local_5c = (pTexInfo->MSAA).NumSamples;
  }
  uVar1 = GmmTextureCalc::ExpandHeight
                    (&this->super_GmmTextureCalc,pTexInfo->BaseHeight,UnitAlignment,local_5c);
  MipLevel = 0;
  i = 0;
  for (VAlign = 1; VAlign <= local_50; VAlign = VAlign + 1) {
    uVar2 = (*(this->super_GmmTextureCalc)._vptr_GmmTextureCalc[0x19])(this,pTexInfo,(ulong)VAlign);
    if ((((ulong)(pTexInfo->Flags).Gpu >> 6 & 1) == 0) &&
       (((ulong)(pTexInfo->Flags).Gpu >> 0x1d & 1) == 0)) {
      local_68 = 1;
    }
    else {
      local_68 = (pTexInfo->MSAA).NumSamples;
    }
    uVar2 = GmmTextureCalc::ExpandHeight(&this->super_GmmTextureCalc,uVar2,UnitAlignment,local_68);
    if (VAlign != 1) {
      MipLevel = uVar2 + MipLevel;
      uVar2 = i;
    }
    i = uVar2;
  }
  if (MipLevel <= i) {
    MipLevel = i;
  }
  HeightLinesLevel0 = MipLevel + uVar1;
  return HeightLinesLevel0;
}

Assistant:

uint32_t GmmLib::GmmGen9TextureCalc::Get2DMipMapTotalHeight(GMM_TEXTURE_INFO *pTexInfo)
{
    uint32_t BlockHeight, MipHeight;
    uint32_t HeightLinesLevel0, HeightLinesLevel1, HeightLinesLevel2;
    uint32_t i, MipLevel, VAlign;
    uint32_t AlignedHeightLines;

    GMM_DPF_ENTER;

    MipHeight = pTexInfo->BaseHeight;
    MipLevel  = pTexInfo->MaxLod;
    VAlign    = pTexInfo->Alignment.VAlign;

    MipLevel =
    (pTexInfo->Flags.Info.TiledYf || GMM_IS_64KB_TILE(pTexInfo->Flags)) ?
    GFX_MIN(MipLevel, pTexInfo->Alignment.MipTailStartLod) :
    MipLevel;


    HeightLinesLevel0 = __GMM_EXPAND_HEIGHT(this, MipHeight, VAlign, pTexInfo);

    // Mip0 height...
    BlockHeight = HeightLinesLevel0;

    // Height of Mip1 and Mip2..n needed later...
    HeightLinesLevel1 = HeightLinesLevel2 = 0;
    for(i = 1; i <= MipLevel; i++)
    {
        MipHeight = GmmTexGetMipHeight(pTexInfo, i);

        AlignedHeightLines = __GMM_EXPAND_HEIGHT(this, MipHeight, VAlign, pTexInfo);

        if(i == 1)
        {
            HeightLinesLevel1 = AlignedHeightLines;
        }
        else
        {
            HeightLinesLevel2 += AlignedHeightLines;
        }
    }

    // If Mip1 height covers all others, then that is all we need...
    if(HeightLinesLevel1 >= HeightLinesLevel2)
    {
        BlockHeight += HeightLinesLevel1;
    }
    else
    {
        BlockHeight += HeightLinesLevel2;
    }

    GMM_DPF_EXIT;

    return (BlockHeight);
}